

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processLinkingCommand(CommonCore *this,ActionMessage *cmd)

{
  byte *pbVar1;
  pointer pcVar2;
  size_t sVar3;
  byte *pbVar4;
  InterfaceHandle IVar5;
  BasicHandleInfo *pBVar6;
  string *psVar7;
  GlobalHandle GVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view interfaceName;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view alias;
  
  switch(cmd->messageAction) {
  case cmd_data_link:
    name._M_str = (char *)(cmd->payload).heap;
    name._M_len = (cmd->payload).bufferSize;
    pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name,PUBLICATION);
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    if (pBVar6 == (BasicHandleInfo *)0x0) {
      name_06._M_str = pcVar2;
      name_06._M_len = psVar7->_M_string_length;
      pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_06,INPUT);
      if (pBVar6 == (BasicHandleInfo *)0x0) {
LAB_00253f88:
        routeMessage(this,cmd);
        return;
      }
      ActionMessage::setAction(cmd,cmd_add_named_publication);
      GVar8 = pBVar6->handle;
    }
    else {
      name_00._M_str = pcVar2;
      name_00._M_len = psVar7->_M_string_length;
      ActionMessage::name(cmd,name_00);
      ActionMessage::setAction(cmd,cmd_add_named_input);
      GVar8 = pBVar6->handle;
    }
    cmd->source_id = (GlobalFederateId)GVar8.fed_id.gid;
    cmd->source_handle = (InterfaceHandle)GVar8.handle.hid;
    break;
  default:
    return;
  case cmd_filter_link:
    name_03._M_str = (char *)(cmd->payload).heap;
    name_03._M_len = (cmd->payload).bufferSize;
    pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_03,FILTER);
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    if (pBVar6 == (BasicHandleInfo *)0x0) {
      name_07._M_str = pcVar2;
      name_07._M_len = psVar7->_M_string_length;
      pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_07,ENDPOINT);
      if (pBVar6 == (BasicHandleInfo *)0x0) goto LAB_00253f88;
      ActionMessage::setAction(cmd,cmd_add_named_filter);
      IVar5.hid = (pBVar6->handle).handle.hid;
      cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
      cmd->source_handle = (InterfaceHandle)IVar5.hid;
    }
    else {
      name_04._M_str = pcVar2;
      name_04._M_len = psVar7->_M_string_length;
      ActionMessage::name(cmd,name_04);
      ActionMessage::setAction(cmd,cmd_add_named_endpoint);
      IVar5.hid = (pBVar6->handle).handle.hid;
      cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
      cmd->source_handle = (InterfaceHandle)IVar5.hid;
      if ((pBVar6->flags & 0x200) != 0) {
        pbVar1 = (byte *)((long)&cmd->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
    }
    goto LAB_00253f4d;
  case cmd_endpoint_link:
    name_01._M_str = (char *)(cmd->payload).heap;
    name_01._M_len = (cmd->payload).bufferSize;
    pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_01,ENDPOINT);
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    if (pBVar6 == (BasicHandleInfo *)0x0) {
      name_05._M_str = pcVar2;
      name_05._M_len = psVar7->_M_string_length;
      pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_05,ENDPOINT);
      if (pBVar6 == (BasicHandleInfo *)0x0) goto LAB_00253f88;
      ActionMessage::setAction(cmd,cmd_add_named_endpoint);
      GVar8 = pBVar6->handle;
      (cmd->source_id).gid = GVar8.fed_id.gid.gid;
      (cmd->source_handle).hid = GVar8.handle.hid.hid;
      cmd->counter = 0x65;
    }
    else {
      name_02._M_str = pcVar2;
      name_02._M_len = psVar7->_M_string_length;
      ActionMessage::name(cmd,name_02);
      ActionMessage::setAction(cmd,cmd_add_named_endpoint);
      cmd->counter = 0x65;
      IVar5.hid = (pBVar6->handle).handle.hid;
      cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
      cmd->source_handle = (InterfaceHandle)IVar5.hid;
      *(byte *)&cmd->flags = (byte)cmd->flags | 2;
    }
    break;
  case cmd_add_alias:
    sVar3 = (cmd->payload).bufferSize;
    pbVar4 = (cmd->payload).heap;
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    interfaceName._M_str = (char *)pbVar4;
    interfaceName._M_len = sVar3;
    alias._M_str = (psVar7->_M_dataplus)._M_p;
    alias._M_len = psVar7->_M_string_length;
    HandleManager::addAlias(&this->loopHandles,interfaceName,alias);
    routeMessage(this,cmd,(GlobalFederateId)0x0);
    return;
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&cmd->stringData);
LAB_00253f4d:
  checkForNamedInterface(this,cmd);
  return;
}

Assistant:

void CommonCore::processLinkingCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_DATA_LINK: {
            auto* pub = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_INPUT);
                cmd.setSource(pub->handle);
                cmd.clearStringData();
                checkForNamedInterface(cmd);
            } else {
                auto* input = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                             InterfaceType::INPUT);
                if (input == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    cmd.setSource(input->handle);
                    cmd.clearStringData();
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_ENDPOINT_LINK: {
            auto* ept = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                cmd.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                cmd.setSource(ept->handle);
                setActionFlag(cmd, destination_target);
                cmd.clearStringData();
                checkForNamedInterface(cmd);
            } else {
                auto* target = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                              InterfaceType::ENDPOINT);
                if (target == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    cmd.setSource(target->handle);
                    cmd.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                    cmd.clearStringData();
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_FILTER_LINK: {
            auto* filt = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                cmd.setSource(filt->handle);
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(cmd, clone_flag);
                }
                checkForNamedInterface(cmd);
            } else {
                auto* ept = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                           InterfaceType::ENDPOINT);
                if (ept == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    cmd.setSource(ept->handle);
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_ADD_ALIAS: {
            loopHandles.addAlias(cmd.payload.to_string(), cmd.getString(targetStringLoc));
            routeMessage(std::move(cmd), parent_broker_id);
        } break;
        default:
            break;
    }
}